

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[13],unsigned_int,char[33],char_const*,char[46],unsigned_int,char[31],char_const*,char[20]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [13],uint *Args_1,
          char (*Args_2) [33],char **Args_3,char (*Args_4) [46],uint *Args_5,char (*Args_6) [31],
          char **Args_7,char (*Args_8) [20])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[13],unsigned_int,char[33],char_const*,char[46],unsigned_int,char[31],char_const*,char[20]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [13])this,(uint *)Args,(char (*) [33])Args_1,(char **)Args_2,
             (char (*) [46])Args_3,(uint *)Args_4,(char (*) [31])Args_5,(char **)Args_6,
             (char (*) [20])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}